

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aflatin.c
# Opt level: O0

FT_Error af_latin_hints_compute_edges(AF_GlyphHints hints,AF_Dimension dim)

{
  short sVar1;
  undefined4 a;
  AF_Edge_conflict pAVar2;
  FT_Int32 FVar3;
  long lVar4;
  bool bVar5;
  AF_Edge_conflict local_130;
  FT_Fixed local_128;
  AF_Segment_conflict local_120;
  long local_118;
  FT_Pos seg_delta;
  FT_Pos edge_delta;
  AF_Segment_conflict seg2;
  AF_Edge_conflict edge2;
  int local_f0;
  int iStack_ec;
  FT_Bool is_serif;
  FT_Int is_straight;
  FT_Int is_round;
  AF_Edge_conflict edge_3;
  AF_Edge_conflict edge_limit;
  AF_Edge_conflict edges;
  FT_Pos dist_1;
  AF_Edge_conflict edge_2;
  AF_Edge_conflict pAStack_b8;
  FT_UInt ee_1;
  AF_Edge_conflict found_1;
  AF_Edge_conflict edge_1;
  FT_Pos dist;
  AF_Edge_conflict edge;
  AF_Edge_conflict pAStack_90;
  FT_UInt ee;
  AF_Edge_conflict found;
  FT_Pos segment_width_threshold;
  FT_Pos segment_length_threshold;
  FT_Pos edge_distance_threshold;
  FT_Fixed scale;
  AF_Segment_conflict seg;
  AF_Segment_conflict segment_limit;
  AF_Segment_conflict segments;
  AF_ScriptClass pAStack_48;
  FT_Bool top_to_bottom_hinting;
  AF_ScriptClass script_class;
  AF_StyleClass style_class;
  AF_LatinAxis laxis;
  FT_Memory memory;
  AF_AxisHints pAStack_20;
  FT_Error error;
  AF_AxisHints axis;
  AF_GlyphHints pAStack_10;
  AF_Dimension dim_local;
  AF_GlyphHints hints_local;
  
  pAStack_20 = hints->axis + dim;
  memory._4_4_ = 0;
  laxis = (AF_LatinAxis)hints->memory;
  style_class = (AF_StyleClass)((long)hints->metrics + (ulong)dim * 0x4c90 + 0x50);
  script_class = (AF_ScriptClass)hints->metrics->style_class;
  pAStack_48 = af_script_classes[*(AF_Script *)&script_class->script_uni_ranges];
  segments._7_1_ = '\0';
  segment_limit = pAStack_20->segments;
  if (segment_limit == (AF_Segment_conflict)0x0) {
    local_120 = (AF_Segment_conflict)0x0;
  }
  else {
    local_120 = segment_limit + pAStack_20->num_segments;
  }
  seg = local_120;
  pAStack_20->num_edges = 0;
  if (dim == AF_DIMENSION_HORZ) {
    local_128 = hints->x_scale;
  }
  else {
    local_128 = hints->y_scale;
  }
  edge_distance_threshold = local_128;
  if (dim == AF_DIMENSION_VERT) {
    segments._7_1_ = pAStack_48->top_to_bottom_hinting;
  }
  axis._4_4_ = dim;
  pAStack_10 = hints;
  if (dim == AF_DIMENSION_HORZ) {
    segment_width_threshold = FT_DivFix(0x40,hints->y_scale);
  }
  else {
    segment_width_threshold = 0;
  }
  found = (AF_Edge_conflict)FT_DivFix(0x20,edge_distance_threshold);
  a = style_class[0x14].script;
  FVar3 = FT_MulFix_x86_64(a,(FT_Int32)edge_distance_threshold);
  segment_length_threshold = (FT_Pos)FVar3;
  if (0x10 < segment_length_threshold) {
    segment_length_threshold = 0x10;
  }
  segment_length_threshold = FT_DivFix(segment_length_threshold,edge_distance_threshold);
  for (scale = (FT_Fixed)segment_limit; (ulong)scale < seg; scale = scale + 0x50) {
    pAStack_90 = (AF_Edge_conflict)0x0;
    if ((((segment_width_threshold <= *(short *)(scale + 10)) &&
         ((long)*(short *)(scale + 4) <= (long)found)) && (*(char *)(scale + 1) != '\x04')) &&
       ((*(long *)(scale + 0x28) == 0 ||
        (lVar4 = (long)((int)*(short *)(scale + 10) << 1),
        SBORROW8(lVar4,segment_width_threshold * 3) == lVar4 + segment_width_threshold * -3 < 0))))
    {
      for (edge._4_4_ = 0; pAVar2 = pAStack_90, edge._4_4_ < pAStack_20->num_edges;
          edge._4_4_ = edge._4_4_ + 1) {
        dist = (FT_Pos)(pAStack_20->edges + edge._4_4_);
        edge_1 = (AF_Edge_conflict)
                 (long)((int)*(short *)(scale + 2) - (int)((AF_Edge_conflict)dist)->fpos);
        if ((long)edge_1 < 0) {
          edge_1 = (AF_Edge_conflict)-(long)edge_1;
        }
        if (((long)edge_1 < segment_length_threshold) &&
           (pAVar2 = (AF_Edge_conflict)dist, ((AF_Edge_conflict)dist)->dir == *(char *)(scale + 1)))
        break;
      }
      pAStack_90 = pAVar2;
      if (pAStack_90 == (AF_Edge_conflict)0x0) {
        memory._4_4_ = af_axis_hints_new_edge
                                 (pAStack_20,(int)*(short *)(scale + 2),(int)*(char *)(scale + 1),
                                  segments._7_1_,(FT_Memory)laxis,&found_1);
        if (memory._4_4_ != 0) {
          return memory._4_4_;
        }
        memset(found_1,0,0x58);
        found_1->first = (AF_Segment)scale;
        found_1->last = (AF_Segment)scale;
        found_1->dir = *(FT_Char *)(scale + 1);
        found_1->fpos = *(FT_Short *)(scale + 2);
        FVar3 = FT_MulFix_x86_64((int)*(short *)(scale + 2),(FT_Int32)edge_distance_threshold);
        found_1->opos = (long)FVar3;
        found_1->pos = found_1->opos;
        *(FT_Fixed *)(scale + 0x18) = scale;
      }
      else {
        *(AF_Segment *)(scale + 0x18) = pAStack_90->first;
        pAStack_90->last->edge_next = (AF_Segment)scale;
        pAStack_90->last = (AF_Segment)scale;
      }
    }
  }
  scale = (FT_Fixed)segment_limit;
  do {
    if (seg <= (ulong)scale) {
      pAVar2 = pAStack_20->edges;
      _is_straight = pAVar2;
      if (pAVar2 == (AF_Edge_conflict)0x0) {
        local_130 = (AF_Edge_conflict)0x0;
      }
      else {
        local_130 = pAVar2 + pAStack_20->num_edges;
      }
      for (; _is_straight < local_130; _is_straight = _is_straight + 1) {
        scale = (FT_Fixed)_is_straight->first;
        if ((AF_Segment)scale != (AF_Segment)0x0) {
          do {
            *(AF_Edge_conflict *)(scale + 0x10) = _is_straight;
            scale = *(long *)(scale + 0x18);
          } while ((AF_Segment)scale != _is_straight->first);
        }
      }
      while (_is_straight = pAVar2, _is_straight < local_130) {
        iStack_ec = 0;
        local_f0 = 0;
        scale = (FT_Fixed)_is_straight->first;
        do {
          if ((*(byte *)scale & 1) == 0) {
            local_f0 = local_f0 + 1;
          }
          else {
            iStack_ec = iStack_ec + 1;
          }
          bVar5 = false;
          if ((*(long *)(scale + 0x28) != 0) &&
             (bVar5 = false, *(long *)(*(long *)(scale + 0x28) + 0x10) != 0)) {
            bVar5 = *(AF_Edge_conflict *)(*(long *)(scale + 0x28) + 0x10) != _is_straight;
          }
          if (((*(long *)(scale + 0x20) != 0) && (*(long *)(*(long *)(scale + 0x20) + 0x10) != 0))
             || (bVar5)) {
            seg2 = (AF_Segment_conflict)_is_straight->link;
            edge_delta = *(FT_Pos *)(scale + 0x20);
            if (bVar5) {
              edge_delta = *(FT_Pos *)(scale + 0x28);
              seg2 = (AF_Segment_conflict)_is_straight->serif;
            }
            if (seg2 == (AF_Segment_conflict)0x0) {
              seg2 = *(AF_Segment_conflict *)(edge_delta + 0x10);
            }
            else {
              sVar1._0_1_ = seg2->flags;
              sVar1._1_1_ = seg2->dir;
              seg_delta = (FT_Pos)((int)_is_straight->fpos - (int)sVar1);
              if (seg_delta < 0) {
                seg_delta = -seg_delta;
              }
              local_118 = (long)((int)*(short *)(scale + 2) - (int)*(short *)(edge_delta + 2));
              if (local_118 < 0) {
                local_118 = -local_118;
              }
              if (local_118 < seg_delta) {
                seg2 = *(AF_Segment_conflict *)(edge_delta + 0x10);
              }
            }
            if (bVar5) {
              _is_straight->serif = (AF_Edge)seg2;
              *(byte *)&seg2->edge_next = *(byte *)&seg2->edge_next | 2;
            }
            else {
              _is_straight->link = (AF_Edge)seg2;
            }
          }
          scale = *(long *)(scale + 0x18);
        } while ((AF_Segment)scale != _is_straight->first);
        _is_straight->flags = '\0';
        if ((0 < iStack_ec) && (local_f0 <= iStack_ec)) {
          _is_straight->flags = _is_straight->flags | 1;
        }
        if ((_is_straight->serif != (AF_Edge)0x0) && (_is_straight->link != (AF_Edge)0x0)) {
          _is_straight->serif = (AF_Edge)0x0;
        }
        pAVar2 = _is_straight + 1;
      }
      return memory._4_4_;
    }
    pAStack_b8 = (AF_Edge_conflict)0x0;
    if (*(char *)(scale + 1) == '\x04') {
      for (edge_2._4_4_ = 0; pAVar2 = pAStack_b8, edge_2._4_4_ < pAStack_20->num_edges;
          edge_2._4_4_ = edge_2._4_4_ + 1) {
        edges = (AF_Edge_conflict)
                (long)((int)*(short *)(scale + 2) - (int)pAStack_20->edges[edge_2._4_4_].fpos);
        if ((long)edges < 0) {
          edges = (AF_Edge_conflict)-(long)edges;
        }
        pAVar2 = pAStack_20->edges + edge_2._4_4_;
        if ((long)edges < segment_length_threshold) break;
      }
      pAStack_b8 = pAVar2;
      if (pAStack_b8 != (AF_Edge_conflict)0x0) {
        *(AF_Segment *)(scale + 0x18) = pAStack_b8->first;
        pAStack_b8->last->edge_next = (AF_Segment)scale;
        pAStack_b8->last = (AF_Segment)scale;
      }
    }
    scale = scale + 0x50;
  } while( true );
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  af_latin_hints_compute_edges( AF_GlyphHints  hints,
                                AF_Dimension   dim )
  {
    AF_AxisHints  axis   = &hints->axis[dim];
    FT_Error      error  = FT_Err_Ok;
    FT_Memory     memory = hints->memory;
    AF_LatinAxis  laxis  = &((AF_LatinMetrics)hints->metrics)->axis[dim];

    AF_StyleClass   style_class  = hints->metrics->style_class;
    AF_ScriptClass  script_class = af_script_classes[style_class->script];

    FT_Bool  top_to_bottom_hinting = 0;

    AF_Segment    segments      = axis->segments;
    AF_Segment    segment_limit = FT_OFFSET( segments, axis->num_segments );
    AF_Segment    seg;

#if 0
    AF_Direction  up_dir;
#endif
    FT_Fixed      scale;
    FT_Pos        edge_distance_threshold;
    FT_Pos        segment_length_threshold;
    FT_Pos        segment_width_threshold;


    axis->num_edges = 0;

    scale = ( dim == AF_DIMENSION_HORZ ) ? hints->x_scale
                                         : hints->y_scale;

#if 0
    up_dir = ( dim == AF_DIMENSION_HORZ ) ? AF_DIR_UP
                                          : AF_DIR_RIGHT;
#endif

    if ( dim == AF_DIMENSION_VERT )
      top_to_bottom_hinting = script_class->top_to_bottom_hinting;

    /*
     * We ignore all segments that are less than 1 pixel in length
     * to avoid many problems with serif fonts.  We compute the
     * corresponding threshold in font units.
     */
    if ( dim == AF_DIMENSION_HORZ )
      segment_length_threshold = FT_DivFix( 64, hints->y_scale );
    else
      segment_length_threshold = 0;

    /*
     * Similarly, we ignore segments that have a width delta
     * larger than 0.5px (i.e., a width larger than 1px).
     */
    segment_width_threshold = FT_DivFix( 32, scale );

    /**********************************************************************
     *
     * We begin by generating a sorted table of edges for the current
     * direction.  To do so, we simply scan each segment and try to find
     * an edge in our table that corresponds to its position.
     *
     * If no edge is found, we create and insert a new edge in the
     * sorted table.  Otherwise, we simply add the segment to the edge's
     * list which gets processed in the second step to compute the
     * edge's properties.
     *
     * Note that the table of edges is sorted along the segment/edge
     * position.
     *
     */

    /* assure that edge distance threshold is at most 0.25px */
    edge_distance_threshold = FT_MulFix( laxis->edge_distance_threshold,
                                         scale );
    if ( edge_distance_threshold > 64 / 4 )
      edge_distance_threshold = 64 / 4;

    edge_distance_threshold = FT_DivFix( edge_distance_threshold,
                                         scale );

    for ( seg = segments; seg < segment_limit; seg++ )
    {
      AF_Edge  found = NULL;
      FT_UInt  ee;


      /* ignore too short segments, too wide ones, and, in this loop, */
      /* one-point segments without a direction                       */
      if ( seg->height < segment_length_threshold ||
           seg->delta > segment_width_threshold   ||
           seg->dir == AF_DIR_NONE                )
        continue;

      /* A special case for serif edges: If they are smaller than */
      /* 1.5 pixels we ignore them.                               */
      if ( seg->serif                                     &&
           2 * seg->height < 3 * segment_length_threshold )
        continue;

      /* look for an edge corresponding to the segment */
      for ( ee = 0; ee < axis->num_edges; ee++ )
      {
        AF_Edge  edge = axis->edges + ee;
        FT_Pos   dist;


        dist = seg->pos - edge->fpos;
        if ( dist < 0 )
          dist = -dist;

        if ( dist < edge_distance_threshold && edge->dir == seg->dir )
        {
          found = edge;
          break;
        }
      }

      if ( !found )
      {
        AF_Edge  edge;


        /* insert a new edge in the list and */
        /* sort according to the position    */
        error = af_axis_hints_new_edge( axis, seg->pos,
                                        (AF_Direction)seg->dir,
                                        top_to_bottom_hinting,
                                        memory, &edge );
        if ( error )
          goto Exit;

        /* add the segment to the new edge's list */
        FT_ZERO( edge );

        edge->first    = seg;
        edge->last     = seg;
        edge->dir      = seg->dir;
        edge->fpos     = seg->pos;
        edge->opos     = FT_MulFix( seg->pos, scale );
        edge->pos      = edge->opos;
        seg->edge_next = seg;
      }
      else
      {
        /* if an edge was found, simply add the segment to the edge's */
        /* list                                                       */
        seg->edge_next         = found->first;
        found->last->edge_next = seg;
        found->last            = seg;
      }
    }

    /* we loop again over all segments to catch one-point segments   */
    /* without a direction: if possible, link them to existing edges */
    for ( seg = segments; seg < segment_limit; seg++ )
    {
      AF_Edge  found = NULL;
      FT_UInt  ee;


      if ( seg->dir != AF_DIR_NONE )
        continue;

      /* look for an edge corresponding to the segment */
      for ( ee = 0; ee < axis->num_edges; ee++ )
      {
        AF_Edge  edge = axis->edges + ee;
        FT_Pos   dist;


        dist = seg->pos - edge->fpos;
        if ( dist < 0 )
          dist = -dist;

        if ( dist < edge_distance_threshold )
        {
          found = edge;
          break;
        }
      }

      /* one-point segments without a match are ignored */
      if ( found )
      {
        seg->edge_next         = found->first;
        found->last->edge_next = seg;
        found->last            = seg;
      }
    }


    /*******************************************************************
     *
     * Good, we now compute each edge's properties according to the
     * segments found on its position.  Basically, these are
     *
     * - the edge's main direction
     * - stem edge, serif edge or both (which defaults to stem then)
     * - rounded edge, straight or both (which defaults to straight)
     * - link for edge
     *
     */

    /* first of all, set the `edge' field in each segment -- this is */
    /* required in order to compute edge links                       */

    /*
     * Note that removing this loop and setting the `edge' field of each
     * segment directly in the code above slows down execution speed for
     * some reasons on platforms like the Sun.
     */
    {
      AF_Edge  edges      = axis->edges;
      AF_Edge  edge_limit = FT_OFFSET( edges, axis->num_edges );
      AF_Edge  edge;


      for ( edge = edges; edge < edge_limit; edge++ )
      {
        seg = edge->first;
        if ( seg )
          do
          {
            seg->edge = edge;
            seg       = seg->edge_next;

          } while ( seg != edge->first );
      }

      /* now compute each edge properties */
      for ( edge = edges; edge < edge_limit; edge++ )
      {
        FT_Int  is_round    = 0;  /* does it contain round segments?    */
        FT_Int  is_straight = 0;  /* does it contain straight segments? */
#if 0
        FT_Pos  ups         = 0;  /* number of upwards segments         */
        FT_Pos  downs       = 0;  /* number of downwards segments       */
#endif


        seg = edge->first;

        do
        {
          FT_Bool  is_serif;


          /* check for roundness of segment */
          if ( seg->flags & AF_EDGE_ROUND )
            is_round++;
          else
            is_straight++;

#if 0
          /* check for segment direction */
          if ( seg->dir == up_dir )
            ups   += seg->max_coord - seg->min_coord;
          else
            downs += seg->max_coord - seg->min_coord;
#endif

          /* check for links -- if seg->serif is set, then seg->link must */
          /* be ignored                                                   */
          is_serif = FT_BOOL( seg->serif               &&
                              seg->serif->edge         &&
                              seg->serif->edge != edge );

          if ( ( seg->link && seg->link->edge ) || is_serif )
          {
            AF_Edge     edge2;
            AF_Segment  seg2;


            edge2 = edge->link;
            seg2  = seg->link;

            if ( is_serif )
            {
              seg2  = seg->serif;
              edge2 = edge->serif;
            }

            if ( edge2 )
            {
              FT_Pos  edge_delta;
              FT_Pos  seg_delta;


              edge_delta = edge->fpos - edge2->fpos;
              if ( edge_delta < 0 )
                edge_delta = -edge_delta;

              seg_delta = seg->pos - seg2->pos;
              if ( seg_delta < 0 )
                seg_delta = -seg_delta;

              if ( seg_delta < edge_delta )
                edge2 = seg2->edge;
            }
            else
              edge2 = seg2->edge;

            if ( is_serif )
            {
              edge->serif   = edge2;
              edge2->flags |= AF_EDGE_SERIF;
            }
            else
              edge->link  = edge2;
          }

          seg = seg->edge_next;

        } while ( seg != edge->first );

        /* set the round/straight flags */
        edge->flags = AF_EDGE_NORMAL;

        if ( is_round > 0 && is_round >= is_straight )
          edge->flags |= AF_EDGE_ROUND;

#if 0
        /* set the edge's main direction */
        edge->dir = AF_DIR_NONE;

        if ( ups > downs )
          edge->dir = (FT_Char)up_dir;

        else if ( ups < downs )
          edge->dir = (FT_Char)-up_dir;

        else if ( ups == downs )
          edge->dir = 0;  /* both up and down! */
#endif

        /* get rid of serifs if link is set                 */
        /* XXX: This gets rid of many unpleasant artefacts! */
        /*      Example: the `c' in cour.pfa at size 13     */

        if ( edge->serif && edge->link )
          edge->serif = NULL;
      }
    }

  Exit:
    return error;
  }